

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

bool tcu::verifyPointGroupRasterization
               (Surface *surface,PointSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  pointer pSVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pSVar5;
  Vec4 *pVVar6;
  bool bVar7;
  long lVar8;
  int pointNdx;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Vec2 pointScreenSpace;
  Vector<float,_2> local_168;
  Vector<float,_2> local_160;
  TriangleSceneSpec triangleScene;
  Vec2 lineQuadNormalizedDeviceSpace [4];
  Vector<float,_2> local_118;
  Vector<float,_2> local_110;
  Vector<float,_2> local_108;
  Vector<float,_2> local_100;
  undefined1 local_f8 [16];
  Surface *local_e0;
  RasterizationArguments *local_d8;
  TestLog *local_d0;
  Vector<float,_2> local_c8;
  Vector<float,_2> local_c0;
  Vector<float,_2> local_b8;
  Vector<float,_2> local_b0;
  Vector<float,_2> local_a8;
  Vector<float,_2> local_a0;
  Vector<float,_2> local_98;
  Vector<float,_2> local_90;
  Vector<float,_2> local_88;
  Vector<float,_2> local_80;
  Vector<float,_2> local_78;
  Vector<float,_2> local_70;
  Vector<float,_2> local_68;
  Vector<float,_2> local_60;
  Vector<float,_2> local_58;
  Vector<float,_2> local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar3 = surface->m_width;
  uVar4 = surface->m_height;
  local_a0.m_data[0] = (float)(int)uVar3;
  local_a0.m_data[1] = (float)(int)uVar4;
  triangleScene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  triangleScene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  triangleScene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = surface;
  local_d8 = args;
  local_d0 = log;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(&triangleScene.triangles,
           (((long)(scene->points).
                   super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(scene->points).
                  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x24) * 2);
  iVar11 = 1;
  lVar10 = 0;
  lVar12 = 0;
  lVar9 = 0;
  while( true ) {
    pSVar5 = (scene->points).
             super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(scene->points).
                     super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5) / 0x24) <= lVar9)
    break;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)((long)(pSVar5->position).m_data + lVar10);
    uVar2 = *(undefined4 *)((long)(pSVar5->position).m_data + lVar10 + 0xc);
    auVar14._4_4_ = uVar2;
    auVar14._0_4_ = uVar2;
    auVar14._8_8_ = 0;
    auVar14 = divps(auVar13,auVar14);
    local_a8.m_data = auVar14._0_8_;
    local_168.m_data[0] = 1.0;
    local_168.m_data[1] = 1.0;
    operator+(&local_a8,&local_168);
    operator*(0.5,&local_160);
    operator*(lineQuadNormalizedDeviceSpace,&local_a0);
    local_100.m_data[0] =
         *(float *)((long)(&((scene->points).
                             super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                             ._M_impl.super__Vector_impl_data._M_start)->color + 1) + lVar10) * 0.5;
    local_f8 = ZEXT416((uint)local_100.m_data[0]);
    local_100.m_data[0] = -local_100.m_data[0];
    uStack_44 = 0x80000000;
    uStack_40 = 0x80000000;
    uStack_3c = 0x80000000;
    local_100.m_data[1] = local_100.m_data[0];
    local_48 = local_100.m_data[0];
    operator+(&pointScreenSpace,&local_100);
    operator/(&local_50,&local_a0);
    operator*(2.0,&local_168);
    local_b0.m_data[0] = 1.0;
    local_b0.m_data[1] = 1.0;
    operator-(&local_160,&local_b0);
    local_108.m_data[0] = local_48;
    local_108.m_data[1] = (float)local_f8._0_4_;
    operator+(&pointScreenSpace,&local_108);
    operator/(&local_68,&local_a0);
    operator*(2.0,&local_60);
    local_b8.m_data[0] = 1.0;
    local_b8.m_data[1] = 1.0;
    operator-(&local_58,&local_b8);
    local_110.m_data[0] = (float)local_f8._0_4_;
    local_110.m_data[1] = (float)local_f8._0_4_;
    operator+(&pointScreenSpace,&local_110);
    operator/(&local_80,&local_a0);
    operator*(2.0,&local_78);
    local_c0.m_data[0] = 1.0;
    local_c0.m_data[1] = 1.0;
    operator-(&local_70,&local_c0);
    local_118.m_data[0] = (float)local_f8._0_4_;
    local_118.m_data[1] = local_48;
    operator+(&pointScreenSpace,&local_118);
    operator/(&local_98,&local_a0);
    operator*(2.0,&local_90);
    local_c8.m_data[0] = 1.0;
    local_c8.m_data[1] = 1.0;
    operator-(&local_88,&local_c8);
    lVar8 = lVar12 >> 0x20;
    pSVar1 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar8;
    *(float (*) [2])pSVar1->positions[0].m_data = lineQuadNormalizedDeviceSpace[0].m_data;
    pSVar1->positions[0].m_data[2] = 0.0;
    pSVar1->positions[0].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar8].sharedEdge[0] = false;
    pVVar6 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar8].positions;
    *(float (*) [2])pVVar6[1].m_data = lineQuadNormalizedDeviceSpace[1].m_data;
    pVVar6[1].m_data[2] = 0.0;
    pVVar6[1].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar8].sharedEdge[1] = false;
    pVVar6 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar8].positions;
    *(float (*) [2])pVVar6[2].m_data = lineQuadNormalizedDeviceSpace[2].m_data;
    pVVar6[2].m_data[2] = 0.0;
    pVVar6[2].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar8].sharedEdge[2] = true;
    pSVar1 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar11;
    *(float (*) [2])pSVar1->positions[0].m_data = lineQuadNormalizedDeviceSpace[0].m_data;
    pSVar1->positions[0].m_data[2] = 0.0;
    pSVar1->positions[0].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[iVar11].sharedEdge[0] = true;
    pVVar6 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar11].positions;
    *(float (*) [2])pVVar6[1].m_data = lineQuadNormalizedDeviceSpace[2].m_data;
    pVVar6[1].m_data[2] = 0.0;
    pVVar6[1].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[iVar11].sharedEdge[1] = false;
    pVVar6 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar11].positions;
    *(float (*) [2])pVVar6[2].m_data = lineQuadNormalizedDeviceSpace[3].m_data;
    pVVar6[2].m_data[2] = 0.0;
    pVVar6[2].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[iVar11].sharedEdge[2] = false;
    lVar9 = lVar9 + 1;
    iVar11 = iVar11 + 2;
    lVar12 = lVar12 + 0x200000000;
    lVar10 = lVar10 + 0x24;
  }
  bVar7 = verifyTriangleGroupRasterization
                    (local_e0,&triangleScene,local_d8,local_d0,VERIFICATIONMODE_STRICT);
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&triangleScene);
  return bVar7;
}

Assistant:

bool verifyPointGroupRasterization (const tcu::Surface& surface, const PointSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	// Splitting to triangles is a valid solution in multisampled cases and even in non-multisample cases too.
	return verifyMultisamplePointGroupRasterization(surface, scene, args, log);
}